

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  long lVar1;
  u8 *puVar2;
  char **ppcVar3;
  VtabCtx *pVVar4;
  sqlite3_vtab *psVar5;
  byte *pbVar6;
  int iVar7;
  VTable *pVTab;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  byte *pbVar11;
  uint uVar12;
  Schema **ppSVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  char *zErr;
  VtabCtx sCtx;
  uint local_70;
  char *local_58;
  char *local_50;
  Table *local_48;
  VtabCtx local_40;
  
  ppcVar3 = pTab->azModuleArg;
  iVar7 = pTab->nModuleArg;
  local_58 = (char *)0x0;
  local_50 = sqlite3MPrintf(db,"%s",pTab->zName);
  if (local_50 == (char *)0x0) {
    iVar7 = 7;
  }
  else {
    pVTab = (VTable *)sqlite3DbMallocRaw(db,0x30);
    if (pVTab == (VTable *)0x0) {
      iVar7 = 7;
    }
    else {
      pVTab->db = (sqlite3 *)0x0;
      pVTab->pMod = (Module *)0x0;
      *(undefined8 *)&pVTab->iSavepoint = 0;
      pVTab->pNext = (VTable *)0x0;
      pVTab->pVtab = (sqlite3_vtab *)0x0;
      pVTab->nRef = 0;
      pVTab->bConstraint = '\0';
      *(undefined3 *)&pVTab->field_0x1d = 0;
      pVTab->db = db;
      pVTab->pMod = pMod;
      if (pTab->pSchema == (Schema *)0x0) {
        uVar17 = 0xfff0bdc0;
      }
      else {
        uVar12 = db->nDb;
        if ((int)uVar12 < 1) {
          uVar17 = 0;
        }
        else {
          ppSVar13 = &db->aDb->pSchema;
          uVar8 = 0;
          do {
            uVar17 = uVar8;
            if (*ppSVar13 == pTab->pSchema) break;
            uVar8 = uVar8 + 1;
            ppSVar13 = ppSVar13 + 4;
            uVar17 = (ulong)uVar12;
          } while (uVar12 != uVar8);
        }
      }
      pTab->azModuleArg[1] = db->aDb[(int)uVar17].zName;
      pVVar4 = db->pVtabCtx;
      db->pVtabCtx = &local_40;
      local_48 = pTab;
      local_40.pVTable = pVTab;
      local_40.pTab = pTab;
      iVar7 = (*xConstruct)(db,pMod->pAux,iVar7,ppcVar3,&pVTab->pVtab,&local_58);
      db->pVtabCtx = pVVar4;
      if (iVar7 == 0) {
        psVar5 = pVTab->pVtab;
        iVar7 = 0;
        if (psVar5 != (sqlite3_vtab *)0x0) {
          psVar5->pModule = (sqlite3_module *)0x0;
          *(undefined8 *)&psVar5->nRef = 0;
          psVar5->zErrMsg = (char *)0x0;
          pVTab->pVtab->pModule = pMod->pModule;
          pVTab->nRef = 1;
          if (local_40.pTab == (Table *)0x0) {
            pVTab->pNext = local_48->pVTable;
            local_48->pVTable = pVTab;
            if (0 < local_48->nCol) {
              lVar10 = 0;
              do {
                pbVar6 = (byte *)local_48->aCol[lVar10].zType;
                if (pbVar6 != (byte *)0x0) {
                  uVar17 = 0xffffffffffffffff;
                  uVar12 = 0;
                  do {
                    uVar16 = uVar12;
                    lVar14 = uVar17 + 1;
                    uVar17 = uVar17 + 1;
                    uVar12 = uVar16 + 1;
                  } while (pbVar6[lVar14] != 0);
                  local_70 = (uint)uVar17 & 0x3fffffff;
                  lVar14 = 6;
                  pcVar9 = " hidden";
                  pbVar11 = pbVar6;
                  do {
                    pcVar9 = (char *)((byte *)pcVar9 + 1);
                    if (""[(byte)*pcVar9] != ""[*pbVar11]) goto LAB_0013e70b;
                    pbVar11 = pbVar11 + 1;
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                  lVar14 = 0;
                  pcVar9 = "";
                  pbVar11 = pbVar6 + 6;
LAB_0013e70b:
                  if (((((int)lVar14 < 1) || (""[(byte)*pcVar9] == ""[*pbVar11])) &&
                      ((pbVar6[6] & 0xdf) == 0)) || ((uVar17 & 0x3fffffff) == 0)) {
                    uVar16 = 0;
                  }
                  else {
                    uVar16 = uVar16 & 0x3fffffff;
                    uVar8 = 0;
                    do {
                      lVar14 = 7;
                      pcVar9 = " hidden";
                      pbVar11 = pbVar6 + uVar8;
                      do {
                        if (""[(byte)*pcVar9] != ""[*pbVar11]) goto LAB_0013e786;
                        pbVar11 = pbVar11 + 1;
                        pcVar9 = (char *)((byte *)pcVar9 + 1);
                        lVar14 = lVar14 + -1;
                      } while (lVar14 != 0);
                      lVar14 = 0;
                      pcVar9 = "";
                      pbVar11 = pbVar6 + uVar8 + 7;
LAB_0013e786:
                      if ((((int)lVar14 < 1) || (""[(byte)*pcVar9] == ""[*pbVar11])) &&
                         (((pbVar6 + uVar8)[7] & 0xdf) == 0)) {
                        uVar16 = (int)uVar8 + 1;
                        break;
                      }
                      uVar8 = uVar8 + 1;
                    } while (uVar8 != uVar16);
                  }
                  if ((int)uVar16 < (int)local_70) {
                    lVar14 = (long)(int)uVar16;
                    uVar12 = 7 - (pbVar6[lVar14 + 6] == 0);
                    if ((int)(uVar16 + uVar12) <= (int)local_70) {
                      lVar15 = lVar14;
                      do {
                        pbVar6[lVar15] = pbVar6[lVar15 + (ulong)uVar12];
                        lVar1 = (ulong)uVar12 + lVar15;
                        lVar15 = lVar15 + 1;
                      } while (lVar1 + 1U <= (ulong)((uint)uVar17 & 0x3fffffff));
                    }
                    if ((0 < (int)uVar16) && (pbVar6[lVar14] == 0)) {
                      pbVar6[(ulong)uVar16 - 1] = 0;
                    }
                    puVar2 = &local_48->aCol[lVar10].colFlags;
                    *puVar2 = *puVar2 | 2;
                  }
                }
                lVar10 = lVar10 + 1;
                iVar7 = 0;
              } while (lVar10 < local_48->nCol);
            }
          }
          else {
            pcVar9 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",
                                    local_48->zName);
            *pzErr = pcVar9;
            sqlite3VtabUnlock(pVTab);
            iVar7 = 1;
          }
        }
      }
      else {
        if (iVar7 == 7) {
          db->mallocFailed = '\x01';
        }
        if (local_58 == (char *)0x0) {
          pcVar9 = sqlite3MPrintf(db,"vtable constructor failed: %s",local_50);
          *pzErr = pcVar9;
        }
        else {
          pcVar9 = sqlite3MPrintf(db,"%s");
          *pzErr = pcVar9;
          sqlite3_free(local_58);
        }
        sqlite3DbFree(db,pVTab);
      }
    }
    sqlite3DbFree(db,local_50);
  }
  return iVar7;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db, 
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx, *pPriorCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg = (const char *const*)pTab->azModuleArg;
  int nArg = pTab->nModuleArg;
  char *zErr = 0;
  char *zModuleName = sqlite3MPrintf(db, "%s", pTab->zName);
  int iDb;

  if( !zModuleName ){
    return SQLITE_NOMEM;
  }

  pVTable = sqlite3DbMallocZero(db, sizeof(VTable));
  if( !pVTable ){
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iDb].zName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  pPriorCtx = db->pVtabCtx;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = pPriorCtx;
  if( rc==SQLITE_NOMEM ) db->mallocFailed = 1;

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pVTable->nRef = 1;
    if( sCtx.pTab ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->pVTable. Then loop through the 
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->pVTable;
      pTab->pVTable = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = pTab->aCol[iCol].zType;
        int nType;
        int i = 0;
        if( !zType ) continue;
        nType = sqlite3Strlen30(zType);
        if( sqlite3StrNICmp("hidden", zType, 6)||(zType[6] && zType[6]!=' ') ){
          for(i=0; i<nType; i++){
            if( (0==sqlite3StrNICmp(" hidden", &zType[i], 7))
             && (zType[i+7]=='\0' || zType[i+7]==' ')
            ){
              i++;
              break;
            }
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}